

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::egl::anon_unknown_0::SharedRenderingPerfCase::iterate(SharedRenderingPerfCase *this)

{
  TestLog *log;
  pointer ppTVar1;
  iterator __position;
  TestContext *this_00;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  pointer puVar5;
  pointer puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  Thread *pTVar8;
  long *__dest;
  deUint64 dVar9;
  _func_int **pp_Var10;
  deUint64 dVar11;
  SampleBuilder *this_01;
  ulong uVar12;
  _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  *p_Var13;
  int precision;
  int iVar14;
  uint uVar15;
  IterateResult IVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  long lVar18;
  char *pcVar19;
  _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  *this_02;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  long *plVar23;
  int iVar24;
  long lVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  double dVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> resultsUs;
  size_type __dnew_1;
  ScopedLogSection threadSection;
  size_type __dnew;
  long *local_300;
  long *local_2f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2e0;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  LogSampleList local_2b8;
  undefined1 local_278 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  string local_258;
  string local_238;
  qpSampleValueTag local_218;
  ios_base local_200 [272];
  ulong local_f0;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [16];
  long *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_268._M_allocated_capacity = 0x666e692074736554;
    local_268._8_2_ = 0x6f;
    paStack_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x9;
    paVar7 = &local_2b8.m_name.field_2;
    local_c8._M_dataplus._M_p = (pointer)0x10;
    local_2b8.m_name._M_dataplus._M_p = (pointer)paVar7;
    local_278 = (undefined1  [8])&local_268;
    local_2b8.m_name._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2b8,(ulong)&local_c8);
    local_2b8.m_name.field_2._M_allocated_capacity = (size_type)local_c8._M_dataplus._M_p;
    builtin_strncpy(local_2b8.m_name._M_dataplus._M_p,"Test information",0x10);
    local_2b8.m_name._M_string_length = (size_type)local_c8._M_dataplus._M_p;
    local_2b8.m_name._M_dataplus._M_p[(long)local_c8._M_dataplus._M_p] = '\0';
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_e8,log,(string *)local_278,&local_2b8.m_name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.m_name._M_dataplus._M_p != paVar7) {
      operator_delete(local_2b8.m_name._M_dataplus._M_p,
                      (ulong)(local_2b8.m_name.field_2._M_allocated_capacity + 1));
    }
    if (local_278 != (undefined1  [8])&local_268) {
      operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
    }
    local_278 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&paStack_270,"Total triangles rendered: : ",0x1c);
    std::ostream::operator<<
              ((ostringstream *)&paStack_270,
               (this->m_config).drawCallCount * (this->m_config).triangleCount *
               (this->m_config).frameCount * (this->m_config).perThreadContextCount *
               (this->m_config).threadCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
    std::ios_base::~ios_base(local_200);
    local_278 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&paStack_270,"Number of threads: ",0x13);
    std::ostream::operator<<((ostringstream *)&paStack_270,(this->m_config).threadCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
    std::ios_base::~ios_base(local_200);
    local_278 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&paStack_270,"Number of contexts used to render with each thread: ",0x34);
    std::ostream::operator<<((ostringstream *)&paStack_270,(this->m_config).perThreadContextCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
    std::ios_base::~ios_base(local_200);
    local_278 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&paStack_270,"Number of frames rendered with each context: ",0x2d);
    std::ostream::operator<<((ostringstream *)&paStack_270,(this->m_config).frameCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
    std::ios_base::~ios_base(local_200);
    local_278 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&paStack_270,"Number of draw calls performed by each frame: ",0x2e);
    std::ostream::operator<<((ostringstream *)&paStack_270,(this->m_config).drawCallCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
    std::ios_base::~ios_base(local_200);
    local_278 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&paStack_270,"Number of triangles rendered by each draw call: ",0x30);
    std::ostream::operator<<((ostringstream *)&paStack_270,(this->m_config).triangleCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
    std::ios_base::~ios_base(local_200);
    if ((this->m_config).sharedContexts == true) {
      local_278 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&paStack_270,"Shared contexts.",0x10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_278 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&paStack_270,"No shared contexts.",0x13);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
    std::ios_base::~ios_base(local_200);
    if ((this->m_config).useCoordBuffer == true) {
      local_278 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
      pcVar19 = "";
      bVar26 = (this->m_config).sharedCoordBuffer != false;
      if (bVar26) {
        pcVar19 = "Shared ";
      }
      lVar18 = 7;
      if (!bVar26) {
        lVar18 = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_270,pcVar19,lVar18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&paStack_270,"Coordinate buffer",0x11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_278 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&paStack_270,"Coordinates from pointer",0x18);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
    std::ios_base::~ios_base(local_200);
    if ((this->m_config).useIndices == true) {
      local_278 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&paStack_270,"Using glDrawElements with indices from ",0x27);
      pcVar19 = "";
      bVar26 = (this->m_config).sharedIndexBuffer != false;
      if (bVar26) {
        pcVar19 = "shared ";
      }
      lVar18 = 7;
      if (!bVar26) {
        lVar18 = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_270,pcVar19,lVar18);
      uVar21 = (ulong)(this->m_config).useIndexBuffer;
      pcVar19 = "pointer.";
      if (uVar21 != 0) {
        pcVar19 = "buffer.";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_270,pcVar19,8 - uVar21)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
      std::ios_base::~ios_base(local_200);
    }
    if ((this->m_config).useTexture == true) {
      switch((this->m_config).textureType) {
      case TEXTURETYPE_TEXTURE:
        local_278 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&paStack_270,"Use texture.",0xc);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_SHARED_TEXTURE:
        local_278 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&paStack_270,"Use shared texture.",0x13);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_IMAGE:
        local_278 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&paStack_270,"Use texture created from EGLImage.",0x22);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_SHARED_IMAGE:
        local_278 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&paStack_270,"Use texture created from shared EGLImage.",0x29);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      case TEXTURETYPE_SHARED_IMAGE_TEXTURE:
        local_278 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&paStack_270,"Use shared texture created from EGLImage.",0x29);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
        break;
      default:
        goto switchD_001f8c6e_default;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
      std::ios_base::~ios_base(local_200);
switchD_001f8c6e_default:
      local_278 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&paStack_270,"Texture size: ",0xe);
      std::ostream::operator<<((ostringstream *)&paStack_270,(this->m_config).textureWidth);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_270,"x",1);
      std::ostream::operator<<((ostringstream *)&paStack_270,(this->m_config).textureHeight);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
      std::ios_base::~ios_base(local_200);
    }
    if ((this->m_config).sharedProgram == true) {
      local_278 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&paStack_270,"Shared program.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
      std::ios_base::~ios_base(local_200);
    }
    local_278 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_270,"Surface size: ",0xe)
    ;
    std::ostream::operator<<((ostringstream *)&paStack_270,(this->m_config).surfaceWidth);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_270,"x",1);
    std::ostream::operator<<((ostringstream *)&paStack_270,(this->m_config).surfaceHeight);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
    std::ios_base::~ios_base(local_200);
    tcu::TestLog::endSection((TestLog *)local_e8._M_dataplus._M_p);
  }
  local_2c4 = (this->m_config).threadCount;
  uVar21 = (ulong)(uint)(this->m_config).perThreadContextCount;
  paStack_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_268._M_allocated_capacity = 0;
  if (local_2c4 < 1) {
    local_300 = (long *)0x0;
    local_2f8 = (long *)0x0;
    plVar23 = (long *)0x0;
  }
  else {
    iVar24 = 0;
    local_300 = (long *)0x0;
    plVar23 = (long *)0x0;
    local_2f8 = (long *)0x0;
    iVar14 = 0;
    local_f0 = uVar21;
    do {
      paVar17 = paStack_270;
      paVar7 = paStack_270;
      local_2c0 = iVar14;
      local_2bc = iVar24;
      local_278 = (undefined1  [8])paStack_270;
      local_98 = plVar23;
      if (0 < (int)uVar21) {
        do {
          uVar2 = local_268._M_allocated_capacity;
          ppTVar1 = (this->m_contexts).
                    super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (paStack_270 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_allocated_capacity) {
            sVar22 = (long)paStack_270 - (long)paVar17;
            if (sVar22 == 0x7ffffffffffffff8) {
              local_278 = (undefined1  [8])paVar17;
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar20 = (long)sVar22 >> 3;
            uVar12 = 1;
            if (paStack_270 != paVar17) {
              uVar12 = uVar20;
            }
            p_Var13 = (_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                       *)(uVar12 + uVar20);
            if ((_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                 *)0xffffffffffffffe < p_Var13) {
              p_Var13 = (_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                         *)0xfffffffffffffff;
            }
            this_02 = (_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                       *)0xfffffffffffffff;
            if (!CARRY8(uVar12,uVar20)) {
              this_02 = p_Var13;
            }
            local_a8._0_8_ = this_02;
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)std::
                        _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                        ::_M_allocate(this_02,(size_t)this_02);
            *(TestContext **)((long)paVar7 + sVar22) = ppTVar1[iVar24];
            if (0 < (long)sVar22) {
              memmove(paVar7,paVar17,sVar22);
            }
            if (paVar17 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(paVar17,uVar2 - (long)paVar17);
            }
            paStack_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar7->_M_local_buf + sVar22);
            local_268._M_allocated_capacity = (long)paVar7 + local_a8._0_8_ * 8;
          }
          else {
            paStack_270->_M_allocated_capacity = (size_type)ppTVar1[iVar24];
            paVar7 = paVar17;
          }
          paStack_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paStack_270->_M_local_buf + 8);
          iVar24 = iVar24 + 1;
          uVar21 = uVar21 - 1;
          paVar17 = paVar7;
        } while (uVar21 != 0);
      }
      local_278 = (undefined1  [8])paVar7;
      pTVar8 = (Thread *)operator_new(0x88);
      std::
      vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
      ::vector((vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                *)&local_2b8,
               (vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                *)local_278);
      plVar23 = local_98;
      de::Thread::Thread(pTVar8);
      pTVar8->_vptr_Thread = (_func_int **)&PTR__TestThread_003ec568;
      std::
      vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
      ::vector((vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                *)(pTVar8 + 1),
               (vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                *)&local_2b8);
      *(undefined1 *)&pTVar8[2]._vptr_Thread = 0;
      *(Thread **)&pTVar8[2].m_attribs = pTVar8 + 3;
      pTVar8[2].m_thread = 0;
      *(undefined1 *)&pTVar8[3]._vptr_Thread = 0;
      pTVar8[3].m_thread = 0;
      pTVar8[4]._vptr_Thread = (_func_int **)0x0;
      *(undefined8 *)&pTVar8[4].m_attribs = 0;
      pTVar8[4].m_thread = 0;
      pTVar8[5]._vptr_Thread = (_func_int **)0x0;
      *(undefined8 *)&pTVar8[5].m_attribs = 0;
      if (plVar23 == local_2f8) {
        sVar22 = (long)plVar23 - (long)local_300;
        if (sVar22 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar12 = (long)sVar22 >> 3;
        uVar21 = uVar12;
        if (plVar23 == local_300) {
          uVar21 = 1;
        }
        uVar20 = uVar21 + uVar12;
        if (0xffffffffffffffe < uVar20) {
          uVar20 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar21,uVar12)) {
          uVar20 = 0xfffffffffffffff;
        }
        if (uVar20 == 0) {
          __dest = (long *)0x0;
        }
        else {
          __dest = (long *)operator_new(uVar20 * 8);
        }
        __dest[uVar12] = (long)pTVar8;
        if (0 < (long)sVar22) {
          memmove(__dest,local_300,sVar22);
        }
        uVar21 = local_f0;
        if (local_300 != (long *)0x0) {
          operator_delete(local_300,(long)local_2f8 - (long)local_300);
        }
        plVar23 = (long *)(sVar22 + (long)__dest);
        local_2f8 = __dest + uVar20;
        local_300 = __dest;
      }
      else {
        *plVar23 = (long)pTVar8;
        uVar21 = local_f0;
      }
      iVar14 = local_2c0;
      if (local_2b8.m_name._M_dataplus._M_p != (char *)0x0) {
        operator_delete(local_2b8.m_name._M_dataplus._M_p,
                        local_2b8.m_name.field_2._M_allocated_capacity -
                        (long)local_2b8.m_name._M_dataplus._M_p);
      }
      plVar23 = plVar23 + 1;
      paStack_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278;
      iVar14 = iVar14 + 1;
      iVar24 = local_2bc + (int)uVar21;
    } while (iVar14 != local_2c4);
  }
  local_278 = (undefined1  [8])paStack_270;
  if (paStack_270 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(paStack_270,local_268._M_allocated_capacity - (long)paStack_270);
  }
  dVar9 = deGetMicroseconds();
  uVar15 = (uint)((ulong)((long)plVar23 - (long)local_300) >> 3);
  if (0 < (int)uVar15) {
    lVar18 = 1;
    if (1 < (long)(int)uVar15) {
      lVar18 = (long)(int)uVar15;
    }
    lVar25 = 0;
    do {
      pTVar8 = (Thread *)local_300[lVar25];
      pp_Var10 = (_func_int **)deGetMicroseconds();
      pTVar8[5]._vptr_Thread = pp_Var10;
      de::Thread::start(pTVar8);
      dVar11 = deGetMicroseconds();
      *(deUint64 *)&pTVar8[5].m_attribs = dVar11;
      lVar25 = lVar25 + 1;
    } while (lVar18 != lVar25);
    if (0 < (int)uVar15) {
      lVar18 = 1;
      if (1 < (long)(int)uVar15) {
        lVar18 = (long)(int)uVar15;
      }
      lVar25 = 0;
      do {
        pTVar8 = (Thread *)local_300[lVar25];
        dVar11 = deGetMicroseconds();
        *(deUint64 *)&pTVar8[4].m_attribs = dVar11;
        de::Thread::join(pTVar8);
        dVar11 = deGetMicroseconds();
        pTVar8[4].m_thread = dVar11;
        lVar25 = lVar25 + 1;
      } while (lVar18 != lVar25);
    }
  }
  dVar11 = deGetMicroseconds();
  bVar26 = (int)uVar15 < 1;
  if ((int)uVar15 < 1) {
LAB_001f93a8:
    if (bVar26) {
      if (0 < (int)uVar15) {
        lVar18 = 1;
        if (1 < (long)(int)uVar15) {
          lVar18 = (long)(int)uVar15;
        }
        lVar25 = 0;
        do {
          if ((long *)local_300[lVar25] != (long *)0x0) {
            (**(code **)(*(long *)local_300[lVar25] + 8))();
          }
          local_300[lVar25] = 0;
          lVar25 = lVar25 + 1;
        } while (lVar18 != lVar25);
      }
      local_278 = (undefined1  [8])(dVar11 - dVar9);
      __position._M_current =
           (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&this->m_results,__position,(unsigned_long *)local_278);
      }
      else {
        *__position._M_current = (unsigned_long)local_278;
        (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      IVar16 = CONTINUE;
      if (this->m_iterationCount ==
          (int)((ulong)((long)(this->m_results).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_results).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)this_00->m_log;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_2e0,&this->m_results);
        local_c8.field_2._M_allocated_capacity._0_4_ = 0x75736552;
        local_c8.field_2._M_allocated_capacity._4_2_ = 0x746c;
        local_c8._M_string_length = 6;
        local_c8.field_2._M_local_buf[6] = '\0';
        local_e8.field_2._M_allocated_capacity._0_4_ = 0x75736552;
        local_e8.field_2._M_allocated_capacity._4_2_ = 0x746c;
        local_e8._M_string_length = 6;
        local_e8.field_2._M_local_buf[6] = '\0';
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        tcu::LogSampleList::LogSampleList(&local_2b8,&local_c8,&local_e8);
        tcu::TestLog::startSampleList
                  ((TestLog *)&paVar7->_M_allocated_capacity,&local_2b8.m_name,
                   &local_2b8.m_description);
        tcu::TestLog::startSampleInfo((TestLog *)&paVar7->_M_allocated_capacity);
        local_50.field_2._M_allocated_capacity._0_4_ = 0x656d6954;
        local_50._M_string_length = 4;
        local_50.field_2._M_allocated_capacity._4_4_ =
             local_50.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
        local_70.field_2._M_allocated_capacity._0_4_ = 0x656d6954;
        local_70._M_string_length = 4;
        local_70.field_2._M_allocated_capacity._4_4_ =
             local_70.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
        local_90.field_2._M_allocated_capacity._0_2_ = 0x7375;
        local_90._M_string_length = 2;
        local_90.field_2._M_local_buf[2] = '\0';
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        tcu::LogValueInfo::LogValueInfo
                  ((LogValueInfo *)local_278,&local_50,&local_70,&local_90,
                   QP_SAMPLE_VALUE_TAG_RESPONSE);
        tcu::TestLog::writeValueInfo
                  ((TestLog *)&paVar7->_M_allocated_capacity,(string *)local_278,&local_258,
                   &local_238,local_218);
        tcu::TestLog::endSampleInfo((TestLog *)&paVar7->_M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (local_278 != (undefined1  [8])&local_268) {
          operator_delete((void *)local_278,(ulong)(local_268._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT53(local_90.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_90.field_2._M_local_buf[2],
                                            local_90.field_2._M_allocated_capacity._0_2_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                                   local_70.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                                   local_50.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8.m_description._M_dataplus._M_p != &local_2b8.m_description.field_2) {
          operator_delete(local_2b8.m_description._M_dataplus._M_p,
                          local_2b8.m_description.field_2._M_allocated_capacity + 1);
        }
        paVar17 = &local_2b8.m_name.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8.m_name._M_dataplus._M_p != paVar17) {
          operator_delete(local_2b8.m_name._M_dataplus._M_p,
                          (ulong)(local_2b8.m_name.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT17(local_e8.field_2._M_local_buf[7],
                                   CONCAT16(local_e8.field_2._M_local_buf[6],
                                            CONCAT24(local_e8.field_2._M_allocated_capacity._4_2_,
                                                     local_e8.field_2._M_allocated_capacity._0_4_)))
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT17(local_c8.field_2._M_local_buf[7],
                                   CONCAT16(local_c8.field_2._M_local_buf[6],
                                            CONCAT24(local_c8.field_2._M_allocated_capacity._4_2_,
                                                     local_c8.field_2._M_allocated_capacity._0_4_)))
                          + 1);
        }
        if (0 < (int)((ulong)((long)local_2e0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_2e0.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
          lVar18 = 0;
          do {
            paStack_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
            local_268._M_allocated_capacity = 0;
            local_268._8_8_ = 0;
            local_278 = (undefined1  [8])paVar7;
            this_01 = tcu::SampleBuilder::operator<<
                                ((SampleBuilder *)local_278,
                                 local_2e0.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar18]);
            tcu::SampleBuilder::operator<<(this_01,(EndSampleToken *)&tcu::TestLog::EndSample);
            if (paStack_270 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(paStack_270,local_268._8_8_ - (long)paStack_270);
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < (int)((ulong)((long)local_2e0.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_2e0.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        tcu::TestLog::endSampleList((TestLog *)&paVar7->_M_allocated_capacity);
        puVar6 = local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        puVar5 = local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if (local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar21 = (long)local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          lVar18 = 0x3f;
          if (uVar21 != 0) {
            for (; uVar21 >> lVar18 == 0; lVar18 = lVar18 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar5,puVar6);
        }
        uVar21 = (long)local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        uVar15 = (uint)uVar21;
        if ((int)uVar15 < 1) {
          uVar12 = 0;
        }
        else {
          uVar20 = 0;
          uVar12 = 0;
          do {
            uVar12 = uVar12 + local_2e0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar20];
            uVar20 = uVar20 + 1;
          } while ((uVar15 & 0x7fffffff) != uVar20);
        }
        uVar12 = uVar12 / uVar21;
        dVar3 = 0.0;
        if (0 < (int)uVar15) {
          uVar20 = 0;
          dVar3 = 0.0;
          do {
            lVar18 = (local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar20] - uVar12) *
                     (local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar20] - uVar12);
            auVar32._8_4_ = (int)((ulong)lVar18 >> 0x20);
            auVar32._0_8_ = lVar18;
            auVar32._12_4_ = 0x45300000;
            dVar3 = dVar3 + (auVar32._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0);
            uVar20 = uVar20 + 1;
          } while ((uVar15 & 0x7fffffff) != uVar20);
        }
        uVar2 = *(undefined8 *)
                 ((long)local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + (uVar21 & 0xfffffffffffffffe) * 4
                 );
        auVar31._8_4_ =
             (int)((long)local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x23);
        auVar31._0_8_ = uVar21;
        auVar31._12_4_ = 0x45300000;
        dVar3 = dVar3 / ((auVar31._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar15) - 4503599627370496.0));
        if (dVar3 < 0.0) {
          dVar3 = sqrt(dVar3);
        }
        else {
          dVar3 = SQRT(dVar3);
        }
        local_278 = (undefined1  [8])&local_268;
        local_2b8.m_name._M_dataplus._M_p = (pointer)0x17;
        local_278 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_278,(ulong)&local_2b8);
        local_268._M_allocated_capacity = (size_type)local_2b8.m_name._M_dataplus._M_p;
        *(undefined8 *)local_278 = 0x6974736974617453;
        *(char *)((long)local_278 + 8) = 'c';
        *(char *)((long)local_278 + 9) = 's';
        *(char *)((long)local_278 + 10) = ' ';
        *(char *)((long)local_278 + 0xb) = 'f';
        *(char *)((long)local_278 + 0xc) = 'r';
        *(char *)((long)local_278 + 0xd) = 'o';
        *(char *)((long)local_278 + 0xe) = 'm';
        *(char *)((long)local_278 + 0xf) = ' ';
        *(char *)((long)local_278 + 0xf) = ' ';
        *(char *)((long)local_278 + 0x10) = 'r';
        *(char *)((long)local_278 + 0x11) = 'e';
        *(char *)((long)local_278 + 0x12) = 's';
        *(char *)((long)local_278 + 0x13) = 'u';
        *(char *)((long)local_278 + 0x14) = 'l';
        *(char *)((long)local_278 + 0x15) = 't';
        *(char *)((long)local_278 + 0x16) = 's';
        paStack_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2b8.m_name._M_dataplus._M_p;
        *(char *)((long)local_278 + (long)local_2b8.m_name._M_dataplus._M_p) = '\0';
        local_c8._M_dataplus._M_p = (pointer)0x17;
        local_2b8.m_name._M_dataplus._M_p = (pointer)paVar17;
        local_2b8.m_name._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_2b8,(ulong)&local_c8);
        local_2b8.m_name.field_2._M_allocated_capacity = (size_type)local_c8._M_dataplus._M_p;
        builtin_strncpy(local_2b8.m_name._M_dataplus._M_p,"Statistics from results",0x17);
        local_2b8.m_name._M_string_length = (size_type)local_c8._M_dataplus._M_p;
        local_2b8.m_name._M_dataplus._M_p[(long)local_c8._M_dataplus._M_p] = '\0';
        tcu::ScopedLogSection::ScopedLogSection
                  ((ScopedLogSection *)&local_e8,(TestLog *)&paVar7->_M_allocated_capacity,
                   (string *)local_278,&local_2b8.m_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8.m_name._M_dataplus._M_p != paVar17) {
          operator_delete(local_2b8.m_name._M_dataplus._M_p,
                          (ulong)(local_2b8.m_name.field_2._M_allocated_capacity + 1));
        }
        if (local_278 != (undefined1  [8])&local_268) {
          operator_delete((void *)local_278,(ulong)(local_268._M_allocated_capacity + 1));
        }
        local_278 = (undefined1  [8])paVar7;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_270);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_270,"Average: ",9);
        auVar27._8_4_ = (int)(uVar12 >> 0x20);
        auVar27._0_8_ = uVar12;
        auVar27._12_4_ = 0x45300000;
        dVar30 = auVar27._8_8_ - 1.9342813113834067e+25;
        dVar4 = (dVar30 + ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0)) / 1000.0;
        local_a8._8_4_ = SUB84(dVar30,0);
        local_a8._0_8_ = dVar4;
        local_a8._12_4_ = (int)((ulong)dVar30 >> 0x20);
        std::ostream::_M_insert<double>(dVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_270,"ms\n",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&paStack_270,"Standard deviation: ",0x14);
        std::ostream::_M_insert<double>(dVar3 / 1000.0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_270,"ms\n",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&paStack_270,"Standard error of mean: ",0x18);
        lVar18 = (long)local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        auVar28._8_4_ =
             (int)((long)local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x23);
        auVar28._0_8_ = lVar18;
        auVar28._12_4_ = 0x45300000;
        dVar4 = (auVar28._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0);
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        std::ostream::_M_insert<double>((dVar3 / dVar4) / 1000.0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_270,"ms\n",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_270,"Median: ",8);
        auVar29._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar29._0_8_ = uVar2;
        auVar29._12_4_ = 0x45300000;
        std::ostream::_M_insert<double>
                  (((auVar29._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / 1000.0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_270,"ms\n",3);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_270);
        std::ios_base::~ios_base(local_200);
        tcu::TestLog::endSection((TestLog *)local_e8._M_dataplus._M_p);
        de::floatToString_abi_cxx11_
                  ((string *)local_278,(de *)0x2,(float)(double)local_a8._0_8_,precision);
        tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_278);
        if (local_278 != (undefined1  [8])&local_268) {
          operator_delete((void *)local_278,(ulong)(local_268._M_allocated_capacity + 1));
        }
        if (local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2e0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2e0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        IVar16 = STOP;
      }
      goto LAB_001f9be3;
    }
  }
  else if (*(char *)(*local_300 + 0x30) == '\x01') {
    uVar21 = 1;
    do {
      uVar12 = uVar21;
      if ((uVar15 & 0x7fffffff) == uVar12) break;
      uVar21 = uVar12 + 1;
    } while (*(char *)(local_300[uVar12] + 0x30) != '\0');
    bVar26 = (uVar15 & 0x7fffffff) <= uVar12;
    goto LAB_001f93a8;
  }
  IVar16 = STOP;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Fail");
LAB_001f9be3:
  if (local_300 != (long *)0x0) {
    operator_delete(local_300,(long)local_2f8 - (long)local_300);
  }
  return IVar16;
}

Assistant:

TestCase::IterateResult SharedRenderingPerfCase::iterate (void)
{
	deUint64			beginTimeUs;
	deUint64			endTimeUs;
	vector<TestThread*>	threads;

	if (m_results.empty())
		logTestConfig(m_testCtx.getLog(), m_config);

	createThreads(threads, m_config.threadCount, m_config.perThreadContextCount, m_contexts);

	beginTimeUs = deGetMicroseconds();

	startThreads(threads);
	joinThreads(threads);

	endTimeUs = deGetMicroseconds();

	if (!threadResultsOk(threads))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	destroyThreads(threads);

	m_results.push_back(endTimeUs - beginTimeUs);

	if ((int)m_results.size() == m_iterationCount)
	{
		logAndSetResults(m_testCtx, m_results);
		return STOP;
	}
	else
		return CONTINUE;
}